

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O3

void __thiscall gl4cts::GetTextureSubImage::Tests::Tests(Tests *this,Context *context)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"get_texture_sub_image",
             "Get Texture Sub Image Tests Suite");
  (this->super_TestCaseGroup).m_context = context;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Tests_020c7400;
  pTVar2 = (TestNode *)operator_new(0xb0);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,context->m_testCtx,"errors_test","Get Texture SubImage Errors Test")
  ;
  pTVar2[1]._vptr_TestNode = (_func_int **)context;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__Errors_020c7438;
  pTVar2[1].m_testCtx = (TestContext *)context;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_description._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,(TestContext *)pTVar1->m_platform,"functional_test",
             "Get Texture SubImage Functional Test");
  pTVar2[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__Functional_020c7470;
  pTVar2[1].m_testCtx = pTVar1;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return;
}

Assistant:

gl4cts::GetTextureSubImage::Tests::Tests(deqp::Context& context)
	: TestCaseGroup(context, "get_texture_sub_image", "Get Texture Sub Image Tests Suite")
{
	addChild(new GetTextureSubImage::Errors(m_context));
	addChild(new GetTextureSubImage::Functional(m_context));
}